

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.h
# Opt level: O0

vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> * __thiscall
cnn::DeepLSTMBuilder::final_s(DeepLSTMBuilder *this)

{
  bool bVar1;
  size_type sVar2;
  value_type *__x;
  long *in_RSI;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_RDI;
  Expression my_h;
  iterator __end2;
  iterator __begin2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *__range2;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ret;
  Expression *in_stack_ffffffffffffff68;
  Expression *in_stack_ffffffffffffff70;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *this_00;
  Expression local_68;
  Expression *local_58;
  __normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
  local_50;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffffb8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_ffffffffffffffc0;
  undefined1 local_38 [24];
  undefined1 *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  sVar2 = std::
          vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ::size((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  *)(in_RSI + 0xe));
  if (sVar2 == 0) {
    __x = (value_type *)(in_RSI + 0x18);
  }
  else {
    __x = (value_type *)
          std::
          vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
          ::back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (**(code **)(*in_RSI + 0x18))(local_38);
  local_20 = local_38;
  local_50._M_current =
       (Expression *)
       std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::begin
                 (in_stack_ffffffffffffff68);
  local_58 = (Expression *)
             std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::end
                       ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                        in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    __gnu_cxx::
    __normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
    ::operator*(&local_50);
    in_stack_ffffffffffffff70 = &local_68;
    cnn::expr::Expression::Expression(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
              (this_00,__x);
    __gnu_cxx::
    __normal_iterator<cnn::expr::Expression_*,_std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>
    ::operator++(&local_50);
  }
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::vector<Expression> final_s() const override {
    std::vector<Expression> ret = (c.size() == 0 ? c0 : c.back());
    for(auto my_h : final_h()) ret.push_back(my_h);
    return ret;
  }